

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

Atom writeTargetToProperty(XSelectionRequestEvent *request)

{
  undefined8 uVar1;
  Display *pDVar2;
  unsigned_long uVar3;
  size_t sVar4;
  long in_RDI;
  int j;
  unsigned_long count;
  unsigned_long i_1;
  Atom *targets_1;
  Atom targets [4];
  int formatCount;
  Atom formats [2];
  char *selectionString;
  int i;
  uchar **in_stack_ffffffffffffff60;
  undefined8 uVar5;
  Atom in_stack_ffffffffffffff68;
  undefined8 uVar6;
  Atom in_stack_ffffffffffffff70;
  char *pcVar7;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar8;
  ulong local_78;
  long local_70;
  Atom local_68;
  Atom local_60;
  Atom local_58;
  undefined8 local_50;
  undefined4 local_3c;
  Atom local_38 [3];
  char *local_20;
  int local_14;
  long local_10;
  Atom local_8;
  
  pDVar2 = _glfw.x11.display;
  local_38[0] = _glfw.x11.UTF8_STRING;
  local_38[1] = 0x1f;
  local_3c = 2;
  if (*(Atom *)(in_RDI + 0x30) == _glfw.x11.PRIMARY) {
    local_20 = _glfw.x11.primarySelectionString;
  }
  else {
    local_20 = _glfw.x11.clipboardString;
  }
  pcVar7 = local_20;
  if (*(long *)(in_RDI + 0x40) == 0) {
    local_8 = 0;
  }
  else {
    local_10 = in_RDI;
    if (*(Atom *)(in_RDI + 0x38) == _glfw.x11.TARGETS) {
      local_68 = _glfw.x11.TARGETS;
      local_60 = _glfw.x11.MULTIPLE;
      local_58 = _glfw.x11.UTF8_STRING;
      local_50 = 0x1f;
      XChangeProperty(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x28),
                      *(undefined8 *)(in_RDI + 0x40),4,0x20,0,&local_68,4);
      local_8 = *(Atom *)(local_10 + 0x40);
    }
    else if (*(Atom *)(in_RDI + 0x38) == _glfw.x11.MULTIPLE) {
      uVar3 = _glfwGetWindowPropertyX11
                        (CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         in_stack_ffffffffffffff60);
      for (local_78 = 0; pDVar2 = _glfw.x11.display, local_78 < uVar3; local_78 = local_78 + 2) {
        for (iVar8 = 0; (iVar8 < 2 && (*(Atom *)(local_70 + local_78 * 8) != local_38[iVar8]));
            iVar8 = iVar8 + 1) {
        }
        if (iVar8 < 2) {
          uVar1 = *(undefined8 *)(local_10 + 0x28);
          uVar5 = *(undefined8 *)(local_70 + 8 + local_78 * 8);
          uVar6 = *(undefined8 *)(local_70 + local_78 * 8);
          pcVar7 = local_20;
          sVar4 = strlen(local_20);
          XChangeProperty(pDVar2,uVar1,uVar5,uVar6,8,0,pcVar7,(int)sVar4);
        }
        else {
          *(undefined8 *)(local_70 + 8 + local_78 * 8) = 0;
        }
      }
      XChangeProperty(_glfw.x11.display,*(undefined8 *)(local_10 + 0x28),
                      *(undefined8 *)(local_10 + 0x40),_glfw.x11.ATOM_PAIR,0x20,0,local_70,
                      (int)uVar3);
      XFree(local_70);
      local_8 = *(Atom *)(local_10 + 0x40);
    }
    else if (*(Atom *)(in_RDI + 0x38) == _glfw.x11.SAVE_TARGETS) {
      XChangeProperty(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x28),
                      *(undefined8 *)(in_RDI + 0x40),_glfw.x11.NULL_,0x20,0,0,0);
      local_8 = *(Atom *)(local_10 + 0x40);
    }
    else {
      for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
        if (*(Atom *)(in_RDI + 0x38) == local_38[local_14]) {
          uVar1 = *(undefined8 *)(in_RDI + 0x28);
          uVar5 = *(undefined8 *)(in_RDI + 0x40);
          uVar6 = *(undefined8 *)(in_RDI + 0x38);
          sVar4 = strlen(local_20);
          XChangeProperty(pDVar2,uVar1,uVar5,uVar6,8,0,pcVar7,(int)sVar4);
          return *(Atom *)(local_10 + 0x40);
        }
      }
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

static Atom writeTargetToProperty(const XSelectionRequestEvent* request)
{
    int i;
    char* selectionString = NULL;
    const Atom formats[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const int formatCount = sizeof(formats) / sizeof(formats[0]);

    if (request->selection == _glfw.x11.PRIMARY)
        selectionString = _glfw.x11.primarySelectionString;
    else
        selectionString = _glfw.x11.clipboardString;

    if (request->property == None)
    {
        // The requester is a legacy client (ICCCM section 2.2)
        // We don't support legacy clients, so fail here
        return None;
    }

    if (request->target == _glfw.x11.TARGETS)
    {
        // The list of supported targets was requested

        const Atom targets[] = { _glfw.x11.TARGETS,
                                 _glfw.x11.MULTIPLE,
                                 _glfw.x11.UTF8_STRING,
                                 XA_STRING };

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        (unsigned char*) targets,
                        sizeof(targets) / sizeof(targets[0]));

        return request->property;
    }

    if (request->target == _glfw.x11.MULTIPLE)
    {
        // Multiple conversions were requested

        Atom* targets;
        unsigned long i, count;

        count = _glfwGetWindowPropertyX11(request->requestor,
                                          request->property,
                                          _glfw.x11.ATOM_PAIR,
                                          (unsigned char**) &targets);

        for (i = 0;  i < count;  i += 2)
        {
            int j;

            for (j = 0;  j < formatCount;  j++)
            {
                if (targets[i] == formats[j])
                    break;
            }

            if (j < formatCount)
            {
                XChangeProperty(_glfw.x11.display,
                                request->requestor,
                                targets[i + 1],
                                targets[i],
                                8,
                                PropModeReplace,
                                (unsigned char *) selectionString,
                                strlen(selectionString));
            }
            else
                targets[i + 1] = None;
        }

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        _glfw.x11.ATOM_PAIR,
                        32,
                        PropModeReplace,
                        (unsigned char*) targets,
                        count);

        XFree(targets);

        return request->property;
    }

    if (request->target == _glfw.x11.SAVE_TARGETS)
    {
        // The request is a check whether we support SAVE_TARGETS
        // It should be handled as a no-op side effect target

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        _glfw.x11.NULL_,
                        32,
                        PropModeReplace,
                        NULL,
                        0);

        return request->property;
    }

    // Conversion to a data target was requested

    for (i = 0;  i < formatCount;  i++)
    {
        if (request->target == formats[i])
        {
            // The requested target is one we support

            XChangeProperty(_glfw.x11.display,
                            request->requestor,
                            request->property,
                            request->target,
                            8,
                            PropModeReplace,
                            (unsigned char *) selectionString,
                            strlen(selectionString));

            return request->property;
        }
    }

    // The requested target is not supported

    return None;
}